

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Svd.h
# Opt level: O1

double singular::Svd<60,_50>::calculateShift(BidiagonalMatrix *m,int n)

{
  int i;
  int i_00;
  ulong uVar1;
  double dVar2;
  double l1;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (1 < n) {
    i = n + -2;
    dVar2 = BidiagonalMatrix::operator()(m,i,i);
    i_00 = n + -1;
    dVar4 = BidiagonalMatrix::operator()(m,i_00,i_00);
    dVar5 = BidiagonalMatrix::operator()(m,i,i_00);
    dVar5 = dVar5 * dVar5 + dVar4 * dVar4 + dVar2 * dVar2;
    dVar2 = dVar5 * dVar5 + dVar2 * dVar2 * dVar4 * dVar4 * -4.0;
    if (dVar2 >= 0.0) {
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      dVar3 = (dVar5 + dVar2) * 0.5;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      if (dVar5 <= dVar2) {
        uVar1 = -(ulong)(ABS(dVar4 + dVar3) < ABS(dVar4 - dVar3));
        dVar4 = (double)(~uVar1 & (ulong)dVar3 | (ulong)-dVar3 & uVar1);
      }
      else {
        dVar2 = (dVar5 - dVar2) * 0.5;
        if (dVar2 < 0.0) {
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        if (0.0 <= dVar4) {
          uVar1 = -(ulong)(ABS(dVar4 - dVar3) < ABS(dVar4 - dVar2));
          dVar4 = (double)(~uVar1 & (ulong)dVar2 | (ulong)dVar3 & uVar1);
        }
        else if (ABS(dVar4 + dVar2) <= ABS(dVar4 + dVar3)) {
          dVar4 = -dVar2;
        }
        else {
          dVar4 = -dVar3;
        }
      }
    }
    return dVar4;
  }
  __assert_fail("n >= 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kikuomax[P]singular/src/singular/Svd.h"
                ,0x252,
                "static double singular::Svd<60, 50>::calculateShift(const BidiagonalMatrix &, int) [M = 60, N = 50]"
               );
}

Assistant:

static double calculateShift(const BidiagonalMatrix& m, int n) {
			assert(M >= N);
			assert(n >= 2);
			double b1 = m(n - 2, n - 2);
			double b2 = m(n - 1, n - 1);
			double g1 = m(n - 2, n - 1);
			// solves lambda^4 - d*lambda^2 + e = 0
			// where
			//  d = b1^2 + b2^2 + g1^2
			//  e = b1^2 * b2^2
			// chooses lambda (rho) closest to b2
			double rho;
			double d = b1 * b1 + b2 * b2 + g1 * g1;
			double e = b1 * b1 * b2 * b2;
			// lambda^2 = (d +- sqrt(d^2 - 4e)) / 2
			// so, f = d^2 - 4e must be positive
			double f = d * d - 4 * e;
			if (f >= 0) {
				f = sqrt(f);
				// lambda = +-sqrt(d +- f)  (d >= 0, f >= 0)
				// if d > f, both d+f and d-f have real square roots
				// otherwise considers only d+f
				if (d > f) {
					// lets l1 > l2
					double l1 = sqrt((d + f) * 0.5);
					double l2 = sqrt((d - f) * 0.5);
					// if b2 >= 0, chooses a positive shift
					// otherwise chooses a negative shift
					if (b2 >= 0) {
						if (std::abs(b2 - l1) < std::abs(b2 - l2)) {
							rho = l1;
						} else {
							rho = l2;
						}
					} else {
						if (std::abs(b2 + l1) < std::abs(b2 + l2)) {
							rho = -l1;
						} else {
							rho = -l2;
						}
					}
				} else {
					double l1 = sqrt((d + f) * 0.5);
					if (std::abs(b2 - l1) <= std::abs(b2 + l1)) {
						rho = l1;
					} else {
						rho = -l1;
					}
				}
			} else {
				// no solution. chooses b2 as the shift
				rho = b2;
			}
			return rho;
		}